

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

bool __thiscall slang::ast::SequenceConcatExpr::admitsEmptyImpl(SequenceConcatExpr *this)

{
  uint32_t uVar1;
  pointer pEVar2;
  AssertionExpr *pAVar3;
  bool bVar4;
  pointer pEVar5;
  pointer pEVar6;
  
  if ((this->elements).size_ == 0) {
    assert::assertFailed
              ("it != elements.end()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssertionExpr.cpp"
               ,0x25e,"bool slang::ast::SequenceConcatExpr::admitsEmptyImpl() const");
  }
  pEVar2 = (this->elements).data_;
  if ((pEVar2->delay).min != 0) {
    return false;
  }
  pAVar3 = (pEVar2->sequence).ptr;
  if (pAVar3 != (AssertionExpr *)0x0) {
    bVar4 = AssertionExpr::admitsEmpty(pAVar3);
    if (!bVar4) {
      return false;
    }
    pEVar5 = (this->elements).data_ + (this->elements).size_;
    while( true ) {
      pEVar6 = pEVar2 + 1;
      if (pEVar6 == pEVar5) {
        return true;
      }
      pAVar3 = pEVar2[1].sequence.ptr;
      if (pAVar3 == (AssertionExpr *)0x0) break;
      bVar4 = AssertionExpr::admitsEmpty(pAVar3);
      if (!bVar4) {
        return false;
      }
      uVar1 = (pEVar6->delay).min;
      if (uVar1 != 1) {
        if (uVar1 != 0) {
          return false;
        }
        if ((pEVar2[1].delay.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_engaged == true) &&
           (pEVar2[1].delay.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload._M_value == 0)) {
          return false;
        }
      }
      pEVar5 = (this->elements).data_ + (this->elements).size_;
      pEVar2 = pEVar6;
    }
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,
             "T slang::not_null<const slang::ast::AssertionExpr *>::get() const [T = const slang::ast::AssertionExpr *]"
            );
}

Assistant:

bool SequenceConcatExpr::admitsEmptyImpl() const {
    auto it = elements.begin();
    ASSERT(it != elements.end());

    // See F.3.4.2.2 for the rules here.
    if (it->delay.min != 0 || !it->sequence->admitsEmpty())
        return false;

    while (++it != elements.end()) {
        if (!it->sequence->admitsEmpty())
            return false;

        if (it->delay.min == 0u && it->delay.max == 0u)
            return false;

        if (it->delay.min > 1)
            return false;
    }

    return true;
}